

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

string * __thiscall
common_params_sampling::print_abi_cxx11_
          (string *__return_storage_ptr__,common_params_sampling *this)

{
  char result [1024];
  allocator<char> local_419;
  char local_418 [1032];
  
  snprintf(local_418,0x400,
           "\trepeat_last_n = %d, repeat_penalty = %.3f, frequency_penalty = %.3f, presence_penalty = %.3f\n\tdry_multiplier = %.3f, dry_base = %.3f, dry_allowed_length = %d, dry_penalty_last_n = %d\n\ttop_k = %d, top_p = %.3f, min_p = %.3f, xtc_probability = %.3f, xtc_threshold = %.3f, typical_p = %.3f, top_n_sigma = %.3f, temp = %.3f\n\tmirostat = %d, mirostat_lr = %.3f, mirostat_ent = %.3f"
           ,(double)this->penalty_repeat,(double)this->penalty_freq,(double)this->penalty_present,
           (double)this->dry_multiplier,(double)this->dry_base,(double)this->top_p,
           (double)this->min_p,(double)this->xtc_probability,(ulong)(uint)this->penalty_last_n,
           (ulong)(uint)this->dry_allowed_length,(ulong)(uint)this->dry_penalty_last_n,this->top_k,
           (double)this->xtc_threshold,(double)this->typ_p,(double)this->top_n_sigma,
           (double)this->temp,this->mirostat,(double)this->mirostat_eta,(double)this->mirostat_tau);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_418,&local_419);
  return __return_storage_ptr__;
}

Assistant:

std::string common_params_sampling::print() const {
    char result[1024];

    snprintf(result, sizeof(result),
            "\trepeat_last_n = %d, repeat_penalty = %.3f, frequency_penalty = %.3f, presence_penalty = %.3f\n"
            "\tdry_multiplier = %.3f, dry_base = %.3f, dry_allowed_length = %d, dry_penalty_last_n = %d\n"
            "\ttop_k = %d, top_p = %.3f, min_p = %.3f, xtc_probability = %.3f, xtc_threshold = %.3f, typical_p = %.3f, top_n_sigma = %.3f, temp = %.3f\n"
            "\tmirostat = %d, mirostat_lr = %.3f, mirostat_ent = %.3f",
            penalty_last_n, penalty_repeat, penalty_freq, penalty_present,
            dry_multiplier, dry_base, dry_allowed_length, dry_penalty_last_n,
            top_k, top_p, min_p, xtc_probability, xtc_threshold, typ_p, top_n_sigma, temp,
            mirostat, mirostat_eta, mirostat_tau);

    return std::string(result);
}